

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O2

int nni_plat_udp_open(nni_plat_udp **upp,nni_sockaddr *bindaddr)

{
  int iVar1;
  size_t sVar2;
  nni_plat_udp *pfd;
  int *piVar3;
  undefined1 local_a8 [8];
  sockaddr_storage sa;
  
  iVar1 = 0xf;
  if ((bindaddr != (nni_sockaddr *)0x0) && ((ushort)((short)*(undefined4 *)bindaddr - 3U) < 2)) {
    sVar2 = nni_posix_nn2sockaddr(local_a8,bindaddr);
    if ((int)(socklen_t)sVar2 < 2) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                ,0x14b,"salen > 1");
    }
    pfd = (nni_plat_udp *)nni_zalloc(0x98);
    if (pfd == (nni_plat_udp *)0x0) {
      iVar1 = 2;
    }
    else {
      nni_mtx_init(&pfd->udp_mtx);
      nni_aio_list_init(&pfd->udp_recvq);
      nni_aio_list_init(&pfd->udp_sendq);
      iVar1 = socket((uint)(ushort)local_a8._0_2_,2,0x11);
      pfd->udp_fd = iVar1;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        iVar1 = nni_plat_errno(*piVar3);
      }
      else {
        iVar1 = bind(iVar1,(sockaddr *)local_a8,(socklen_t)sVar2);
        if (iVar1 == 0) {
          nni_posix_pfd_init((nni_posix_pfd *)pfd,pfd->udp_fd,nni_posix_udp_cb,pfd);
          *upp = pfd;
          return 0;
        }
        piVar3 = __errno_location();
        iVar1 = nni_plat_errno(*piVar3);
        close(pfd->udp_fd);
      }
      nni_mtx_fini(&pfd->udp_mtx);
      nni_free(pfd,0x98);
    }
  }
  return iVar1;
}

Assistant:

int
nni_plat_udp_open(nni_plat_udp **upp, nni_sockaddr *bindaddr)
{
	nni_plat_udp           *udp;
	int                     salen;
	struct sockaddr_storage sa;
	int                     rv;

	if (bindaddr == NULL) {
		return (NNG_EADDRINVAL);
	}
	switch (bindaddr->s_family) {
	case NNG_AF_INET:
#ifdef NNG_ENABLE_IPV6
	case NNG_AF_INET6:
#endif
		break;
	default:
		return (NNG_EADDRINVAL);
	}
	salen = nni_posix_nn2sockaddr(&sa, bindaddr);
	NNI_ASSERT(salen > 1);

	// UDP opens can actually run synchronously.
	if ((udp = NNI_ALLOC_STRUCT(udp)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&udp->udp_mtx);
	nni_aio_list_init(&udp->udp_recvq);
	nni_aio_list_init(&udp->udp_sendq);

	udp->udp_fd = socket(sa.ss_family, SOCK_DGRAM, IPPROTO_UDP);
	if (udp->udp_fd < 0) {
		rv = nni_plat_errno(errno);
		nni_mtx_fini(&udp->udp_mtx);
		NNI_FREE_STRUCT(udp);
		return (rv);
	}

	if (bind(udp->udp_fd, (void *) &sa, salen) != 0) {
		rv = nni_plat_errno(errno);
		(void) close(udp->udp_fd);
		nni_mtx_fini(&udp->udp_mtx);
		NNI_FREE_STRUCT(udp);
		return (rv);
	}

	nni_posix_pfd_init(&udp->udp_pfd, udp->udp_fd, nni_posix_udp_cb, udp);

	*upp = udp;
	return (0);
}